

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

void Abc_MfsConvertHopToAig(Abc_Obj_t *pObjOld,Aig_Man_t *pMan)

{
  Hop_Man_t *p;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar2;
  int iVar3;
  Hop_Obj_t *pHVar4;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 *paVar7;
  Hop_Obj_t *pHVar8;
  int local_34;
  int i;
  Abc_Obj_t *pFanin;
  Hop_Obj_t *pRoot;
  Hop_Man_t *pHopMan;
  Aig_Man_t *pMan_local;
  Abc_Obj_t *pObjOld_local;
  
  p = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
  pHVar8 = *(Hop_Obj_t **)&(pObjOld->field_5).iData;
  pHVar4 = Hop_Regular(pHVar8);
  iVar3 = Hop_ObjIsConst1(pHVar4);
  if (iVar3 == 0) {
    for (local_34 = 0; iVar3 = Abc_ObjFaninNum(pObjOld), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar6 = Abc_ObjFanin(pObjOld,local_34);
      aVar1 = pAVar6->field_6;
      paVar7 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)Hop_ManPi(p,local_34);
      *paVar7 = aVar1;
    }
    pHVar4 = Hop_Regular(pHVar8);
    Abc_MfsConvertHopToAig_rec(pHVar4,pMan);
    pHVar4 = Hop_Regular(pHVar8);
    pAVar5 = (Aig_Obj_t *)(pHVar4->field_0).pData;
    iVar3 = Hop_IsComplement(pHVar8);
    pAVar6 = (Abc_Obj_t *)Aig_NotCond(pAVar5,iVar3);
    (pObjOld->field_6).pCopy = pAVar6;
    pHVar4 = Hop_Regular(pHVar8);
    Hop_ConeUnmark_rec(pHVar4);
    for (local_34 = 0; iVar3 = Abc_ObjFaninNum(pObjOld), local_34 < iVar3; local_34 = local_34 + 1)
    {
      pAVar6 = Abc_ObjFanin(pObjOld,local_34);
      aVar2 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)pAVar6->pNext;
      pHVar4 = Hop_ManPi(p,local_34);
      pHVar4->field_0 = aVar2;
    }
    pHVar4 = Hop_Regular(pHVar8);
    Abc_MfsConvertHopToAig_rec(pHVar4,pMan);
    pHVar4 = Hop_Regular(pHVar8);
    pAVar5 = (Aig_Obj_t *)(pHVar4->field_0).pData;
    iVar3 = Hop_IsComplement(pHVar8);
    pAVar6 = (Abc_Obj_t *)Aig_NotCond(pAVar5,iVar3);
    pObjOld->pNext = pAVar6;
    pHVar8 = Hop_Regular(pHVar8);
    Hop_ConeUnmark_rec(pHVar8);
  }
  else {
    pAVar5 = Aig_ManConst1(pMan);
    iVar3 = Hop_IsComplement(pHVar8);
    pAVar6 = (Abc_Obj_t *)Aig_NotCond(pAVar5,iVar3);
    (pObjOld->field_6).pCopy = pAVar6;
    pObjOld->pNext = (Abc_Obj_t *)pObjOld->field_6;
  }
  return;
}

Assistant:

void Abc_MfsConvertHopToAig( Abc_Obj_t * pObjOld, Aig_Man_t * pMan )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    // get the local AIG
    pHopMan = (Hop_Man_t *)pObjOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pObjOld->pData;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
    {
        pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( Aig_ManConst1(pMan), Hop_IsComplement(pRoot) );
        pObjOld->pNext = pObjOld->pCopy;
        return;
    }

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pCopy;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pCopy = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );

    // assign the fanin nodes
    Abc_ObjForEachFanin( pObjOld, pFanin, i )
        Hop_ManPi(pHopMan, i)->pData = pFanin->pNext;
    // construct the AIG
    Abc_MfsConvertHopToAig_rec( Hop_Regular(pRoot), pMan );
    pObjOld->pNext = (Abc_Obj_t *)Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
}